

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xinclude.c
# Opt level: O0

void xmlXIncludeBaseFixup
               (xmlXIncludeCtxtPtr ctxt,xmlNodePtr cur,xmlNodePtr copy,xmlChar *targetBase)

{
  int iVar1;
  xmlChar *pxVar2;
  undefined1 local_68 [4];
  int res;
  xmlNs ns;
  xmlChar *relBase;
  xmlChar *base;
  xmlChar *targetBase_local;
  xmlNodePtr copy_local;
  xmlNodePtr cur_local;
  xmlXIncludeCtxtPtr ctxt_local;
  
  relBase = (xmlChar *)0x0;
  ns.context = (_xmlDoc *)0x0;
  if (cur->type != XML_ELEMENT_NODE) {
    return;
  }
  base = targetBase;
  targetBase_local = (xmlChar *)copy;
  copy_local = cur;
  cur_local = (xmlNodePtr)ctxt;
  iVar1 = xmlNodeGetBaseSafe(cur->doc,cur,&relBase);
  if (iVar1 < 0) {
    xmlXIncludeErrMemory((xmlXIncludeCtxtPtr)cur_local);
  }
  if ((relBase != (xmlChar *)0x0) && (iVar1 = xmlStrEqual(relBase,base), iVar1 == 0)) {
    iVar1 = xmlStrlen(relBase);
    if ((iVar1 < 0x7d1) && (iVar1 = xmlStrlen(base), iVar1 < 0x7d1)) {
      iVar1 = xmlBuildRelativeURISafe(relBase,base,(xmlChar **)&ns.context);
      if (iVar1 < 0) {
        xmlXIncludeErrMemory((xmlXIncludeCtxtPtr)cur_local);
        goto LAB_0021b771;
      }
    }
    else {
      ns.context = (_xmlDoc *)xmlStrdup(relBase);
      if (ns.context == (_xmlDoc *)0x0) {
        xmlXIncludeErrMemory((xmlXIncludeCtxtPtr)cur_local);
        goto LAB_0021b771;
      }
    }
    if (ns.context == (_xmlDoc *)0x0) {
      xmlXIncludeErr((xmlXIncludeCtxtPtr)cur_local,copy_local,0x645,
                     "Building relative URI failed: %s\n",relBase);
      goto LAB_0021b771;
    }
    pxVar2 = xmlStrchr((xmlChar *)ns.context,'/');
    if (pxVar2 != (xmlChar *)0x0) {
      iVar1 = xmlNodeSetBase((xmlNodePtr)targetBase_local,(xmlChar *)ns.context);
      if (iVar1 < 0) {
        xmlXIncludeErrMemory((xmlXIncludeCtxtPtr)cur_local);
      }
      goto LAB_0021b771;
    }
  }
  memset(local_68,0,0x30);
  ns._8_8_ = anon_var_dwarf_fa31;
  xmlUnsetNsProp((xmlNodePtr)targetBase_local,(xmlNsPtr)local_68,"base");
LAB_0021b771:
  (*xmlFree)(relBase);
  (*xmlFree)(ns.context);
  return;
}

Assistant:

static void
xmlXIncludeBaseFixup(xmlXIncludeCtxtPtr ctxt, xmlNodePtr cur, xmlNodePtr copy,
                     const xmlChar *targetBase) {
    xmlChar *base = NULL;
    xmlChar *relBase = NULL;
    xmlNs ns;
    int res;

    if (cur->type != XML_ELEMENT_NODE)
        return;

    if (xmlNodeGetBaseSafe(cur->doc, cur, &base) < 0)
        xmlXIncludeErrMemory(ctxt);

    if ((base != NULL) && !xmlStrEqual(base, targetBase)) {
        if ((xmlStrlen(base) > XML_MAX_URI_LENGTH) ||
            (xmlStrlen(targetBase) > XML_MAX_URI_LENGTH)) {
            relBase = xmlStrdup(base);
            if (relBase == NULL) {
                xmlXIncludeErrMemory(ctxt);
                goto done;
            }
        } else if (xmlBuildRelativeURISafe(base, targetBase, &relBase) < 0) {
            xmlXIncludeErrMemory(ctxt);
            goto done;
        }
        if (relBase == NULL) {
            xmlXIncludeErr(ctxt, cur,
                    XML_XINCLUDE_HREF_URI,
                    "Building relative URI failed: %s\n",
                    base);
            goto done;
        }

        /*
         * If the new base doesn't contain a slash, it can be omitted.
         */
        if (xmlStrchr(relBase, '/') != NULL) {
            res = xmlNodeSetBase(copy, relBase);
            if (res < 0)
                xmlXIncludeErrMemory(ctxt);
            goto done;
        }
    }

    /*
     * Delete existing xml:base if bases are equal
     */
    memset(&ns, 0, sizeof(ns));
    ns.href = XML_XML_NAMESPACE;
    xmlUnsetNsProp(copy, &ns, BAD_CAST "base");

done:
    xmlFree(base);
    xmlFree(relBase);
}